

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::UnserializeUInt(IMkvReader *pReader,longlong pos,longlong size)

{
  int iVar1;
  ulong in_RAX;
  ulong uVar2;
  bool bVar3;
  ulong uStack_38;
  uchar b;
  
  if (size - 9U < 0xfffffffffffffff8 || (pos < 0 || pReader == (IMkvReader *)0x0)) {
    uVar2 = 0xfffffffffffffffe;
  }
  else {
    uVar2 = 0;
    uStack_38 = in_RAX;
    while (bVar3 = size != 0, size = size + -1, bVar3) {
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,&b);
      if (iVar1 < 0) {
        return (long)iVar1;
      }
      uVar2 = uVar2 << 8 | uStack_38 >> 0x38;
      pos = pos + 1;
    }
  }
  return uVar2;
}

Assistant:

long long UnserializeUInt(IMkvReader* pReader, long long pos, long long size) {
  if (!pReader || pos < 0 || (size <= 0) || (size > 8))
    return E_FILE_FORMAT_INVALID;

  long long result = 0;

  for (long long i = 0; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}